

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O1

void __thiscall
unodb::test::
tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::do_remove(tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
            *this,key_type k,bool bypass_verifier)

{
  size_t sVar1;
  bool bVar2;
  undefined7 in_register_00000009;
  __extent_storage<18446744073709551615UL> val1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  char *pcVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  pVar5;
  key_type key;
  span<const_std::byte,_18446744073709551615UL> key_00;
  uint64_t key_prefix_splits_before;
  undefined1 auStack_118 [8];
  node_type_counter_array node_counts_before;
  AssertHelper AStack_e8;
  inode_type_counter_array shrinking_inodes_before;
  size_t mem_use_before;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Stack_b8;
  inode_type_counter_array growing_inodes_before;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  size_type remove_result;
  AssertHelper local_58;
  size_t mem_use_after;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  value_type leaf_count_after;
  
  key_00._M_ptr = k._M_extent._M_extent_value;
  if ((int)CONCAT71(in_register_00000009,bypass_verifier) == 0) {
    key._M_extent._M_extent_value = (size_t)k._M_ptr;
    key._M_ptr = (pointer)this;
    to_ikey((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
             *)auStack_118,key);
    pVar5 = std::
            _Rb_tree<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
            ::equal_range(&(this->values)._M_t,(key_type *)auStack_118);
    sVar1 = (this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    _Rb_tree<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::_M_erase_aux(&(this->values)._M_t,(_Base_ptr)pVar5.first._M_node,
                   (_Base_ptr)pVar5.second._M_node);
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (sVar1 - (this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (node_counts_before._M_elems[0] != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)node_counts_before._M_elems[0]);
    }
    _Stack_b8._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)auStack_118,"(remove_result)","(1)",(unsigned_long *)&local_88,
               (int *)&_Stack_b8);
    if (auStack_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&_Stack_b8);
      if (node_counts_before._M_elems[0] == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)node_counts_before._M_elems[0];
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x121,pcVar4);
      testing::internal::AssertHelper::operator=(&AStack_e8,(Message *)&_Stack_b8);
      testing::internal::AssertHelper::~AssertHelper(&AStack_e8);
      if (_Stack_b8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)_Stack_b8._M_head_impl + 8))();
      }
    }
    if (node_counts_before._M_elems[0] != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&node_counts_before,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   node_counts_before._M_elems[0]);
    }
    if (auStack_118[0] == (internal)0x0) {
      return;
    }
  }
  node_counts_before._M_elems[3] = (this->test_db).node_counts._M_elems[4];
  auStack_118 = (undefined1  [8])(this->test_db).node_counts._M_elems[0];
  node_counts_before._M_elems[0] = (this->test_db).node_counts._M_elems[1];
  node_counts_before._M_elems[1] = (this->test_db).node_counts._M_elems[2];
  node_counts_before._M_elems[2] = (this->test_db).node_counts._M_elems[3];
  shrinking_inodes_before._M_elems[3] = (this->test_db).current_memory_use;
  _Stack_b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)_Stack_b8._M_head_impl._4_4_ << 0x20);
  testing::internal::CmpHelperGT<unsigned_long,int>
            ((internal *)&local_88,"(node_counts_before[as_i<unodb::node_type::LEAF>])","(0)",
             (unsigned_long *)auStack_118,(int *)&_Stack_b8);
  if (local_88._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&_Stack_b8);
    if (remove_result == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)remove_result;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x127,pcVar4);
    testing::internal::AssertHelper::operator=(&AStack_e8,(Message *)&_Stack_b8);
LAB_00219c09:
    testing::internal::AssertHelper::~AssertHelper(&AStack_e8);
    _Var3._M_head_impl = _Stack_b8._M_head_impl;
  }
  else {
    if (remove_result != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&remove_result,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   remove_result);
    }
    _Stack_b8._M_head_impl = _Stack_b8._M_head_impl & 0xffffffff00000000;
    val1._M_extent_value = (size_t)(shrinking_inodes_before._M_elems + 3);
    testing::internal::CmpHelperGT<unsigned_long,int>
              ((internal *)&local_88,"(mem_use_before)","(0)",(unsigned_long *)val1._M_extent_value,
               (int *)&_Stack_b8);
    if (local_88._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&_Stack_b8);
      if (remove_result == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)remove_result;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x128,pcVar4);
      testing::internal::AssertHelper::operator=(&AStack_e8,(Message *)&_Stack_b8);
      goto LAB_00219c09;
    }
    if (remove_result != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&remove_result,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   remove_result);
    }
    _Stack_b8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (this->test_db).growing_inode_counts._M_elems[0];
    growing_inodes_before._M_elems[0] = (this->test_db).growing_inode_counts._M_elems[1];
    growing_inodes_before._M_elems[1] = (this->test_db).growing_inode_counts._M_elems[2];
    growing_inodes_before._M_elems[2] = (this->test_db).growing_inode_counts._M_elems[3];
    AStack_e8.data_ = (AssertHelperData *)(this->test_db).shrinking_inode_counts._M_elems[0];
    shrinking_inodes_before._M_elems[0] = (this->test_db).shrinking_inode_counts._M_elems[1];
    shrinking_inodes_before._M_elems[1] = (this->test_db).shrinking_inode_counts._M_elems[2];
    shrinking_inodes_before._M_elems[2] = (this->test_db).shrinking_inode_counts._M_elems[3];
    bVar2 = db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
            ::remove_internal(&this->test_db,(art_key_type)k);
    if (!bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"test_db.remove failed for ",0x1a);
      key_00._M_extent._M_extent_value = val1._M_extent_value;
      unodb::detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
                ((detail *)&std::cerr,(ostream *)k._M_ptr,key_00);
      local_90._M_head_impl._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,(char *)&local_90,1);
      db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
      ::dump(&this->test_db,(ostream *)&std::cerr);
      testing::Message::Message((Message *)&local_88);
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x135,"Failed");
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_88._M_head_impl ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        return;
      }
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
      return;
    }
    if (this->parallel_test != false) {
      return;
    }
    local_58.data_ = (AssertHelperData *)(this->test_db).current_memory_use;
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)&local_88,"(mem_use_after)","(mem_use_before)",(unsigned_long *)&local_58
               ,shrinking_inodes_before._M_elems + 3);
    if (local_88._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      if (remove_result == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)remove_result;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x14c,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      _Var3._M_head_impl = local_40._M_head_impl;
    }
    else {
      if (remove_result != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&remove_result,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     remove_result);
      }
      local_40._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (this->test_db).node_counts._M_elems[0];
      local_90._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)auStack_118 + -1);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_88,"(leaf_count_after)",
                 "(node_counts_before[as_i<unodb::node_type::LEAF>] - 1)",(unsigned_long *)&local_40
                 ,(unsigned_long *)&local_90);
      if (local_88._M_head_impl._0_1_ != (internal)0x0) goto LAB_00219c27;
      testing::Message::Message((Message *)&local_90);
      if (remove_result == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)remove_result;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&mem_use_before,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x151,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&mem_use_before,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mem_use_before);
      _Var3._M_head_impl = local_90._M_head_impl;
    }
  }
  if (_Var3._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)((long)*(_Type *)_Var3._M_head_impl + 8))();
  }
LAB_00219c27:
  if (remove_result != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&remove_result,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)remove_result)
    ;
  }
  return;
}

Assistant:

void do_remove(key_type k, bool bypass_verifier) {
    if (!bypass_verifier) {
      const auto remove_result = values.erase(to_ikey(k));
      UNODB_ASSERT_EQ(remove_result, 1);
    }

#ifdef UNODB_DETAIL_WITH_STATS
    const auto node_counts_before = test_db.get_node_counts();
    const auto mem_use_before = test_db.get_current_memory_use();
    UNODB_ASSERT_GT(node_counts_before[as_i<unodb::node_type::LEAF>], 0);
    UNODB_ASSERT_GT(mem_use_before, 0);
    const auto growing_inodes_before = test_db.get_growing_inode_counts();
    const auto shrinking_inodes_before = test_db.get_shrinking_inode_counts();
    const auto key_prefix_splits_before = test_db.get_key_prefix_splits();
#endif  // UNODB_DETAIL_WITH_STATS

    try {
      if (!test_db.remove(k)) {
        // LCOV_EXCL_START
        std::cerr << "test_db.remove failed for ";
        unodb::detail::dump_key(std::cerr, k);
        std::cerr << '\n';
        test_db.dump(std::cerr);
        FAIL();
        // LCOV_EXCL_STOP
      }
    } catch (...) {
#ifdef UNODB_DETAIL_WITH_STATS
      if (!parallel_test) {
        UNODB_ASSERT_EQ(mem_use_before, test_db.get_current_memory_use());
        UNODB_ASSERT_THAT(test_db.get_node_counts(),
                          ::testing::ElementsAreArray(node_counts_before));
        UNODB_ASSERT_THAT(test_db.get_growing_inode_counts(),
                          ::testing::ElementsAreArray(growing_inodes_before));
        UNODB_ASSERT_THAT(test_db.get_shrinking_inode_counts(),
                          ::testing::ElementsAreArray(shrinking_inodes_before));
        UNODB_ASSERT_EQ(test_db.get_key_prefix_splits(),
                        key_prefix_splits_before);
      }
#endif  // UNODB_DETAIL_WITH_STATS
      throw;
    }

#ifdef UNODB_DETAIL_WITH_STATS
    if (!parallel_test) {
      const auto mem_use_after = test_db.get_current_memory_use();
      UNODB_ASSERT_LT(mem_use_after, mem_use_before);

      const auto leaf_count_after =
          test_db.template get_node_count<::unodb::node_type::LEAF>();
      UNODB_ASSERT_EQ(leaf_count_after,
                      node_counts_before[as_i<unodb::node_type::LEAF>] - 1);
    }
#endif  // UNODB_DETAIL_WITH_STATS
  }